

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall position::position(position *this,istringstream *fen)

{
  istringstream *fen_local;
  position *this_local;
  
  haVoc::Movehistory::Movehistory(&this->stats);
  piece_data::piece_data(&this->pcs);
  std::__cxx11::string::string((string *)&this->bestmove);
  parameters::parameters(&this->params);
  this->debug_search = false;
  std::vector<Rootmove,_std::allocator<Rootmove>_>::vector(&this->root_moves);
  setup(this,fen);
  return;
}

Assistant:

position::position(std::istringstream& fen) {
	setup(fen);
}